

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementNSImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMElementNSImpl::setName
          (DOMElementNSImpl *this,XMLCh *namespaceURI,XMLCh *qualifiedName)

{
  DOMDocument *pDVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  XMLCh *pXVar5;
  DOMException *this_00;
  undefined4 extraout_var;
  undefined8 *puVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *namespaceURI_00;
  DOMDocumentImpl *this_01;
  
  pDVar1 = (this->super_DOMElementImpl).fParent.fOwnerDocument;
  this_01 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
  if (pDVar1 == (DOMDocument *)0x0) {
    this_01 = (DOMDocumentImpl *)0x0;
  }
  pXVar5 = DOMDocumentImpl::getPooledString(this_01,qualifiedName);
  (this->super_DOMElementImpl).fName = pXVar5;
  uVar3 = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
  if ((int)uVar3 < 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar4 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_00,iVar4) == 0) {
      puVar6 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar4 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])
                        (this);
      puVar6 = (undefined8 *)(CONCAT44(extraout_var_02,iVar4) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar6);
  }
  else {
    if (uVar3 == 0) {
      this->fPrefix = (XMLCh *)0x0;
      this->fLocalName = (this->super_DOMElementImpl).fName;
      pXVar5 = (XMLCh *)0x0;
LAB_0027d0e4:
      namespaceURI_00 = (XMLCh *)0x0;
      if ((namespaceURI != (XMLCh *)0x0) && (*namespaceURI != L'\0')) {
        namespaceURI_00 = namespaceURI;
      }
      pXVar5 = DOMNodeImpl::mapPrefix(pXVar5,namespaceURI_00,1);
      if (pXVar5 == (XMLCh *)0x0) {
        pXVar5 = (XMLCh *)0x0;
      }
      else {
        pXVar5 = DOMDocumentImpl::getPooledString(this_01,pXVar5);
      }
      this->fNamespaceURI = pXVar5;
      return;
    }
    pXVar5 = DOMDocumentImpl::getPooledNString(this_01,qualifiedName,(ulong)uVar3);
    this->fPrefix = pXVar5;
    pXVar5 = DOMDocumentImpl::getPooledString
                       (this_01,(this->super_DOMElementImpl).fName + (ulong)uVar3 + 1);
    this->fLocalName = pXVar5;
    bVar2 = DOMDocumentImpl::isXMLName(this_01,this->fPrefix);
    if (bVar2) {
      bVar2 = DOMDocumentImpl::isXMLName(this_01,this->fLocalName);
      if (bVar2) {
        pXVar5 = this->fPrefix;
        goto LAB_0027d0e4;
      }
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar4 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var,iVar4) == 0) {
      puVar6 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar4 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])
                        (this);
      puVar6 = (undefined8 *)(CONCAT44(extraout_var_01,iVar4) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar6);
  }
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMElementNSImpl::setName(const XMLCh *namespaceURI,
                               const XMLCh *qualifiedName)
{
    DOMDocumentImpl* ownerDoc = (DOMDocumentImpl *) fParent.fOwnerDocument;
    this->fName = ownerDoc->getPooledString(qualifiedName);

    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
    if (index < 0)
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    if (index == 0)
    {
        //qualifiedName contains no ':'
        //
        fPrefix = 0;
        fLocalName = fName;
    }
    else
    {	//0 < index < this->name.length()-1
        //
        fPrefix = ownerDoc->getPooledNString(qualifiedName, index);
        fLocalName = ownerDoc->getPooledString(fName+index+1);

        // Before we carry on, we should check if the prefix or localName are valid XMLName
        if (!ownerDoc->isXMLName(fPrefix) || !ownerDoc->isXMLName(fLocalName))
          throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    }

    // DOM Level 3: namespace URI is never empty string.
    //
    const XMLCh * URI = DOMNodeImpl::mapPrefix (
      fPrefix,
      (!namespaceURI || !*namespaceURI) ? 0 : namespaceURI,
      DOMNode::ELEMENT_NODE);

    fNamespaceURI = (URI == 0) ? 0 : ownerDoc->getPooledString(URI);
}